

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  uchar *in_RCX;
  secp256k1_pubkey *pubkey;
  secp256k1_pubkey *in_RSI;
  secp256k1_context *ctx;
  secp256k1_fe *unaff_R14;
  bool bVar5;
  secp256k1_ge sStack_98;
  secp256k1_ge *psStack_30;
  secp256k1_fe *psStack_28;
  
  ctx = (secp256k1_context *)r;
  secp256k1_ge_verify(r);
  if (r->infinity == 0) {
    unaff_R14 = &r->y;
    ctx = (secp256k1_context *)unaff_R14;
    secp256k1_fe_verify(unaff_R14);
    if ((r->y).normalized != 0) {
      bVar5 = (unaff_R14->n[0] & 1) != 0;
      if (bVar5) {
        secp256k1_fe_verify(unaff_R14);
        secp256k1_fe_verify_magnitude(unaff_R14,1);
        uVar1 = (r->y).n[1];
        uVar2 = (r->y).n[2];
        uVar3 = (r->y).n[3];
        (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
        (r->y).n[1] = 0x3ffffffffffffc - uVar1;
        (r->y).n[2] = 0x3ffffffffffffc - uVar2;
        (r->y).n[3] = 0x3ffffffffffffc - uVar3;
        (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
        (r->y).magnitude = 2;
        (r->y).normalized = 0;
        secp256k1_fe_verify(unaff_R14);
      }
      return (uint)bVar5;
    }
  }
  else {
    secp256k1_extrakeys_ge_even_y_cold_1();
  }
  secp256k1_extrakeys_ge_even_y_cold_2();
  psStack_30 = r;
  psStack_28 = unaff_R14;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_tweak_add_cold_4();
  }
  else if (in_RSI != (secp256k1_pubkey *)0x0) {
    in_RSI->data[0x30] = '\0';
    in_RSI->data[0x31] = '\0';
    in_RSI->data[0x32] = '\0';
    in_RSI->data[0x33] = '\0';
    in_RSI->data[0x34] = '\0';
    in_RSI->data[0x35] = '\0';
    in_RSI->data[0x36] = '\0';
    in_RSI->data[0x37] = '\0';
    in_RSI->data[0x38] = '\0';
    in_RSI->data[0x39] = '\0';
    in_RSI->data[0x3a] = '\0';
    in_RSI->data[0x3b] = '\0';
    in_RSI->data[0x3c] = '\0';
    in_RSI->data[0x3d] = '\0';
    in_RSI->data[0x3e] = '\0';
    in_RSI->data[0x3f] = '\0';
    in_RSI->data[0x20] = '\0';
    in_RSI->data[0x21] = '\0';
    in_RSI->data[0x22] = '\0';
    in_RSI->data[0x23] = '\0';
    in_RSI->data[0x24] = '\0';
    in_RSI->data[0x25] = '\0';
    in_RSI->data[0x26] = '\0';
    in_RSI->data[0x27] = '\0';
    in_RSI->data[0x28] = '\0';
    in_RSI->data[0x29] = '\0';
    in_RSI->data[0x2a] = '\0';
    in_RSI->data[0x2b] = '\0';
    in_RSI->data[0x2c] = '\0';
    in_RSI->data[0x2d] = '\0';
    in_RSI->data[0x2e] = '\0';
    in_RSI->data[0x2f] = '\0';
    in_RSI->data[0x10] = '\0';
    in_RSI->data[0x11] = '\0';
    in_RSI->data[0x12] = '\0';
    in_RSI->data[0x13] = '\0';
    in_RSI->data[0x14] = '\0';
    in_RSI->data[0x15] = '\0';
    in_RSI->data[0x16] = '\0';
    in_RSI->data[0x17] = '\0';
    in_RSI->data[0x18] = '\0';
    in_RSI->data[0x19] = '\0';
    in_RSI->data[0x1a] = '\0';
    in_RSI->data[0x1b] = '\0';
    in_RSI->data[0x1c] = '\0';
    in_RSI->data[0x1d] = '\0';
    in_RSI->data[0x1e] = '\0';
    in_RSI->data[0x1f] = '\0';
    in_RSI->data[0] = '\0';
    in_RSI->data[1] = '\0';
    in_RSI->data[2] = '\0';
    in_RSI->data[3] = '\0';
    in_RSI->data[4] = '\0';
    in_RSI->data[5] = '\0';
    in_RSI->data[6] = '\0';
    in_RSI->data[7] = '\0';
    in_RSI->data[8] = '\0';
    in_RSI->data[9] = '\0';
    in_RSI->data[10] = '\0';
    in_RSI->data[0xb] = '\0';
    in_RSI->data[0xc] = '\0';
    in_RSI->data[0xd] = '\0';
    in_RSI->data[0xe] = '\0';
    in_RSI->data[0xf] = '\0';
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_cold_2();
      return 0;
    }
    if (in_RCX == (uchar *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_cold_1();
      return 0;
    }
    iVar4 = secp256k1_pubkey_load(ctx,&sStack_98,pubkey);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = secp256k1_ec_pubkey_tweak_add_helper(&sStack_98,in_RCX);
    if (iVar4 != 0) {
      secp256k1_pubkey_save(in_RSI,&sStack_98);
      return 1;
    }
    return 0;
  }
  secp256k1_xonly_pubkey_tweak_add_cold_3();
  return 0;
}

Assistant:

static int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r) {
    int y_parity = 0;
    VERIFY_CHECK(!secp256k1_ge_is_infinity(r));

    if (secp256k1_fe_is_odd(&r->y)) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
        y_parity = 1;
    }
    return y_parity;
}